

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_strncat_l(archive_string *as,void *_p,size_t n,archive_string_conv *sc)

{
  wchar_t wVar1;
  wchar_t wVar2;
  ulong uVar3;
  archive_string *paVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  if (_p == (void *)0x0 || n == 0) {
    if (sc == (archive_string_conv *)0x0) {
      lVar8 = 1;
      bVar9 = false;
    }
    else {
      bVar9 = (sc->flag & L'᐀') != L'\0';
      lVar8 = (ulong)bVar9 + 1;
    }
    paVar4 = archive_string_ensure(as,lVar8 + as->length);
    if (paVar4 == (archive_string *)0x0) {
      wVar2 = L'\xffffffff';
    }
    else {
      as->s[as->length] = '\0';
      wVar2 = L'\0';
      if (bVar9) {
        as->s[as->length + 1] = '\0';
      }
    }
  }
  else if (sc == (archive_string_conv *)0x0) {
    sVar5 = mbsnbytes(_p,n);
    paVar4 = archive_string_append(as,(char *)_p,sVar5);
    wVar2 = -(uint)(paVar4 == (archive_string *)0x0);
  }
  else {
    if ((sc->flag & L'⠀') == L'\0') {
      sVar5 = mbsnbytes(_p,n);
    }
    else {
      uVar3 = 0;
      while ((uVar7 = n >> 1, n >> 1 != uVar3 &&
             ((*(char *)((long)_p + uVar3 * 2) != '\0' ||
              (uVar7 = uVar3, *(char *)((long)_p + uVar3 * 2 + 1) != '\0'))))) {
        uVar3 = uVar3 + 1;
      }
      sVar5 = uVar7 * 2;
    }
    if (sc->nconverter < L'\x02') {
      lVar8 = 0;
      wVar1 = L'\0';
    }
    else {
      (sc->utftmp).length = 0;
      wVar1 = (*sc->converter[0])(&sc->utftmp,_p,sVar5,sc);
      if ((wVar1 != L'\0') && (piVar6 = __errno_location(), *piVar6 == 0xc)) {
        return wVar1;
      }
      wVar1 = wVar1 >> 0x1f & wVar1;
      _p = (sc->utftmp).s;
      sVar5 = (sc->utftmp).length;
      lVar8 = 1;
    }
    wVar2 = (*sc->converter[lVar8])(as,_p,sVar5,sc);
    if (wVar1 < wVar2) {
      wVar2 = wVar1;
    }
  }
  return wVar2;
}

Assistant:

int
archive_strncat_l(struct archive_string *as, const void *_p, size_t n,
    struct archive_string_conv *sc)
{
	const void *s;
	size_t length;
	int i, r = 0, r2;

	/* We must allocate memory even if there is no data for conversion
	 * or copy. This simulates archive_string_append behavior. */
	if (_p == NULL || n == 0) {
		int tn = 1;
		if (sc != NULL && (sc->flag & SCONV_TO_UTF16))
			tn = 2;
		if (archive_string_ensure(as, as->length + tn) == NULL)
			return (-1);
		as->s[as->length] = 0;
		if (tn == 2)
			as->s[as->length+1] = 0;
		return (0);
	}

	/*
	 * If sc is NULL, we just make a copy.
	 */
	if (sc == NULL) {
		length = mbsnbytes(_p, n);
		if (archive_string_append(as, _p, length) == NULL)
			return (-1);/* No memory */
		return (0);
	}

	if (sc->flag & SCONV_FROM_UTF16)
		length = utf16nbytes(_p, n);
	else
		length = mbsnbytes(_p, n);
	s = _p;
	i = 0;
	if (sc->nconverter > 1) {
		sc->utftmp.length = 0;
		r2 = sc->converter[0](&(sc->utftmp), s, length, sc);
		if (r2 != 0 && errno == ENOMEM)
			return (r2);
		if (r > r2)
			r = r2;
		s = sc->utftmp.s;
		length = sc->utftmp.length;
		++i;
	}
	r2 = sc->converter[i](as, s, length, sc);
	if (r > r2)
		r = r2;
	return (r);
}